

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

Result * __thiscall
CoreML::
validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::NeuralNetworkClassifier>
          (Result *__return_storage_ptr__,CoreML *this,Model *model,
          NeuralNetworkClassifier *modelParameters,bool allowEmptyLabels,
          bool defaultClassLabelIsInt64,ValidationPolicy *validationPolicy)

{
  bool bVar1;
  ClassLabelsCase CVar2;
  int iVar3;
  int32_t modelVersion;
  Int64Vector *pIVar4;
  StringVector *pSVar5;
  ModelDescription *interface_00;
  undefined7 in_register_00000089;
  undefined1 local_140 [8];
  Result result;
  ModelDescription *interface;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  byte local_31;
  ValidationPolicy *pVStack_30;
  bool expected_class_is_int64;
  ValidationPolicy *validationPolicy_local;
  bool defaultClassLabelIsInt64_local;
  NeuralNetworkClassifier *pNStack_20;
  bool allowEmptyLabels_local;
  NeuralNetworkClassifier *modelParameters_local;
  Model *model_local;
  
  validationPolicy_local._7_1_ = (byte)modelParameters & 1;
  pVStack_30 = (ValidationPolicy *)CONCAT71(in_register_00000089,defaultClassLabelIsInt64);
  validationPolicy_local._6_1_ = allowEmptyLabels;
  pNStack_20 = (NeuralNetworkClassifier *)model;
  modelParameters_local = (NeuralNetworkClassifier *)this;
  model_local = (Model *)__return_storage_ptr__;
  CVar2 = Specification::NeuralNetworkClassifier::ClassLabels_case((NeuralNetworkClassifier *)model)
  ;
  if (CVar2 == CLASSLABELS_NOT_SET) {
    if ((validationPolicy_local._7_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Classifier models must provide class labels.",
                 (allocator<char> *)((long)&interface + 7));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator((allocator<char> *)((long)&interface + 7));
      return __return_storage_ptr__;
    }
    local_31 = validationPolicy_local._6_1_ & 1;
  }
  else if (CVar2 == kStringClassLabels) {
    if ((validationPolicy_local._7_1_ & 1) == 0) {
      pSVar5 = Specification::NeuralNetworkClassifier::stringclasslabels(pNStack_20);
      iVar3 = Specification::StringVector::vector_size(pSVar5);
      if (iVar3 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,
                   "Classifier declared to have String class labels must provide labels.",&local_b9)
        ;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
        return __return_storage_ptr__;
      }
    }
    pIVar4 = Specification::NeuralNetworkClassifier::int64classlabels(pNStack_20);
    iVar3 = Specification::Int64Vector::vector_size(pIVar4);
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,
                 "Classifier declared with String class labels must provide exclusively String class labels."
                 ,&local_e1);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      return __return_storage_ptr__;
    }
    local_31 = 0;
  }
  else if (CVar2 == kInt64ClassLabels) {
    if ((validationPolicy_local._7_1_ & 1) == 0) {
      pIVar4 = Specification::NeuralNetworkClassifier::int64classlabels(pNStack_20);
      iVar3 = Specification::Int64Vector::vector_size(pIVar4);
      if (iVar3 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,
                   "Classifier declared to have Int64 class labels must provide labels.",&local_59);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::allocator<char>::~allocator(&local_59);
        return __return_storage_ptr__;
      }
    }
    pSVar5 = Specification::NeuralNetworkClassifier::stringclasslabels(pNStack_20);
    iVar3 = Specification::StringVector::vector_size(pSVar5);
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "Classifier declared with Int64 class labels must provide exclusively Int64 class labels."
                 ,&local_91);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      return __return_storage_ptr__;
    }
    local_31 = 1;
  }
  interface_00 = Specification::Model::description((Model *)modelParameters_local);
  result.m_message.field_2._8_8_ = interface_00;
  modelVersion = Specification::Model::specificationversion((Model *)modelParameters_local);
  validateFeatureDescriptions<CoreML::Specification::ModelDescription>
            ((Result *)local_140,interface_00,modelVersion,pVStack_30);
  bVar1 = Result::good((Result *)local_140);
  if (bVar1) {
    validateClassifierFeatureDescriptions
              (__return_storage_ptr__,(ModelDescription *)result.m_message.field_2._8_8_,
               (bool)(local_31 & 1));
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_140);
  }
  Result::~Result((Result *)local_140);
  return __return_storage_ptr__;
}

Assistant:

Result validateClassifierInterface(const T& model,
                                       const U& modelParameters,
                                       const bool allowEmptyLabels = false,
                                       const bool defaultClassLabelIsInt64 = false,
                                       const ValidationPolicy& validationPolicy = ValidationPolicy()) {

        bool expected_class_is_int64;

        // validate class labels
        switch (modelParameters.ClassLabels_case()) {
            case U::kInt64ClassLabels:
                if (!allowEmptyLabels && modelParameters.int64classlabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have Int64 class labels must provide labels.");
                }

                if(modelParameters.stringclasslabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared with Int64 class labels must provide exclusively Int64 class labels.");
                }

                expected_class_is_int64 = true;

                break;

            case U::kStringClassLabels:
                if (!allowEmptyLabels && modelParameters.stringclasslabels().vector_size() == 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "Classifier declared to have String class labels must provide labels.");
                }

                if(modelParameters.int64classlabels().vector_size() != 0) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                    "Classifier declared with String class labels must provide exclusively String class labels.");
                }

                expected_class_is_int64 = false;

                break;

            case U::CLASSLABELS_NOT_SET:
                if (!allowEmptyLabels) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Classifier models must provide class labels.");
                }
                expected_class_is_int64 = defaultClassLabelIsInt64;
                break;
        }
        const Specification::ModelDescription& interface = model.description();

            // Validate feature descriptions
        Result result = validateFeatureDescriptions(interface, model.specificationversion(), validationPolicy);
        if (!result.good()) {
            return result;
        }

        return validateClassifierFeatureDescriptions(interface, expected_class_is_int64);
    }